

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O0

void read_debug_vui_parameters(sps_t *sps,bs_t *b)

{
  uint32_t uVar1;
  FILE *local_218;
  FILE *local_210;
  FILE *local_208;
  FILE *local_200;
  FILE *local_1f8;
  FILE *local_1f0;
  FILE *local_1e8;
  FILE *local_1e0;
  FILE *local_1d8;
  FILE *local_1d0;
  FILE *local_1c8;
  FILE *local_1c0;
  FILE *local_1b8;
  FILE *local_1b0;
  FILE *local_1a8;
  FILE *local_1a0;
  FILE *local_198;
  FILE *local_190;
  FILE *local_188;
  FILE *local_180;
  FILE *local_178;
  FILE *local_170;
  FILE *local_168;
  FILE *local_160;
  FILE *local_158;
  FILE *local_150;
  FILE *local_148;
  FILE *local_140;
  FILE *local_138;
  FILE *local_130;
  FILE *local_128;
  FILE *local_120;
  FILE *local_118;
  FILE *local_110;
  FILE *local_108;
  FILE *local_100;
  FILE *local_f8;
  FILE *local_f0;
  FILE *local_e8;
  FILE *local_e0;
  FILE *local_d8;
  FILE *local_d0;
  FILE *local_c8;
  FILE *local_c0;
  FILE *local_b8;
  FILE *local_b0;
  FILE *local_a8;
  FILE *local_a0;
  FILE *local_98;
  FILE *local_90;
  FILE *local_88;
  FILE *local_80;
  FILE *local_78;
  FILE *local_70;
  FILE *local_68;
  FILE *local_60;
  FILE *local_58;
  FILE *local_50;
  FILE *local_48;
  FILE *local_40;
  FILE *local_38;
  FILE *local_30;
  FILE *local_28;
  FILE *local_20;
  bs_t *b_local;
  sps_t *sps_local;
  
  if (h264_dbgfile == (FILE *)0x0) {
    local_20 = _stdout;
  }
  else {
    local_20 = (FILE *)h264_dbgfile;
  }
  fprintf(local_20,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar1 = bs_read_u1(b);
  (sps->vui).aspect_ratio_info_present_flag = uVar1;
  if (h264_dbgfile == (FILE *)0x0) {
    local_28 = _stdout;
  }
  else {
    local_28 = (FILE *)h264_dbgfile;
  }
  fprintf(local_28,"sps->vui.aspect_ratio_info_present_flag: %d \n",
          (ulong)(uint)(sps->vui).aspect_ratio_info_present_flag);
  if ((sps->vui).aspect_ratio_info_present_flag != 0) {
    if (h264_dbgfile == (FILE *)0x0) {
      local_30 = _stdout;
    }
    else {
      local_30 = (FILE *)h264_dbgfile;
    }
    fprintf(local_30,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar1 = bs_read_u8(b);
    (sps->vui).aspect_ratio_idc = uVar1;
    if (h264_dbgfile == (FILE *)0x0) {
      local_38 = _stdout;
    }
    else {
      local_38 = (FILE *)h264_dbgfile;
    }
    fprintf(local_38,"sps->vui.aspect_ratio_idc: %d \n",(ulong)(uint)(sps->vui).aspect_ratio_idc);
    if ((sps->vui).aspect_ratio_idc == 0xff) {
      if (h264_dbgfile == (FILE *)0x0) {
        local_40 = _stdout;
      }
      else {
        local_40 = (FILE *)h264_dbgfile;
      }
      fprintf(local_40,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      uVar1 = bs_read_u(b,0x10);
      (sps->vui).sar_width = uVar1;
      if (h264_dbgfile == (FILE *)0x0) {
        local_48 = _stdout;
      }
      else {
        local_48 = (FILE *)h264_dbgfile;
      }
      fprintf(local_48,"sps->vui.sar_width: %d \n",(ulong)(uint)(sps->vui).sar_width);
      if (h264_dbgfile == (FILE *)0x0) {
        local_50 = _stdout;
      }
      else {
        local_50 = (FILE *)h264_dbgfile;
      }
      fprintf(local_50,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      uVar1 = bs_read_u(b,0x10);
      (sps->vui).sar_height = uVar1;
      if (h264_dbgfile == (FILE *)0x0) {
        local_58 = _stdout;
      }
      else {
        local_58 = (FILE *)h264_dbgfile;
      }
      fprintf(local_58,"sps->vui.sar_height: %d \n",(ulong)(uint)(sps->vui).sar_height);
    }
  }
  if (h264_dbgfile == (FILE *)0x0) {
    local_60 = _stdout;
  }
  else {
    local_60 = (FILE *)h264_dbgfile;
  }
  fprintf(local_60,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar1 = bs_read_u1(b);
  (sps->vui).overscan_info_present_flag = uVar1;
  if (h264_dbgfile == (FILE *)0x0) {
    local_68 = _stdout;
  }
  else {
    local_68 = (FILE *)h264_dbgfile;
  }
  fprintf(local_68,"sps->vui.overscan_info_present_flag: %d \n",
          (ulong)(uint)(sps->vui).overscan_info_present_flag);
  if ((sps->vui).overscan_info_present_flag != 0) {
    if (h264_dbgfile == (FILE *)0x0) {
      local_70 = _stdout;
    }
    else {
      local_70 = (FILE *)h264_dbgfile;
    }
    fprintf(local_70,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar1 = bs_read_u1(b);
    (sps->vui).overscan_appropriate_flag = uVar1;
    if (h264_dbgfile == (FILE *)0x0) {
      local_78 = _stdout;
    }
    else {
      local_78 = (FILE *)h264_dbgfile;
    }
    fprintf(local_78,"sps->vui.overscan_appropriate_flag: %d \n",
            (ulong)(uint)(sps->vui).overscan_appropriate_flag);
  }
  if (h264_dbgfile == (FILE *)0x0) {
    local_80 = _stdout;
  }
  else {
    local_80 = (FILE *)h264_dbgfile;
  }
  fprintf(local_80,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar1 = bs_read_u1(b);
  (sps->vui).video_signal_type_present_flag = uVar1;
  if (h264_dbgfile == (FILE *)0x0) {
    local_88 = _stdout;
  }
  else {
    local_88 = (FILE *)h264_dbgfile;
  }
  fprintf(local_88,"sps->vui.video_signal_type_present_flag: %d \n",
          (ulong)(uint)(sps->vui).video_signal_type_present_flag);
  if ((sps->vui).video_signal_type_present_flag != 0) {
    if (h264_dbgfile == (FILE *)0x0) {
      local_90 = _stdout;
    }
    else {
      local_90 = (FILE *)h264_dbgfile;
    }
    fprintf(local_90,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar1 = bs_read_u(b,3);
    (sps->vui).video_format = uVar1;
    if (h264_dbgfile == (FILE *)0x0) {
      local_98 = _stdout;
    }
    else {
      local_98 = (FILE *)h264_dbgfile;
    }
    fprintf(local_98,"sps->vui.video_format: %d \n",(ulong)(uint)(sps->vui).video_format);
    if (h264_dbgfile == (FILE *)0x0) {
      local_a0 = _stdout;
    }
    else {
      local_a0 = (FILE *)h264_dbgfile;
    }
    fprintf(local_a0,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar1 = bs_read_u1(b);
    (sps->vui).video_full_range_flag = uVar1;
    if (h264_dbgfile == (FILE *)0x0) {
      local_a8 = _stdout;
    }
    else {
      local_a8 = (FILE *)h264_dbgfile;
    }
    fprintf(local_a8,"sps->vui.video_full_range_flag: %d \n",
            (ulong)(uint)(sps->vui).video_full_range_flag);
    if (h264_dbgfile == (FILE *)0x0) {
      local_b0 = _stdout;
    }
    else {
      local_b0 = (FILE *)h264_dbgfile;
    }
    fprintf(local_b0,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar1 = bs_read_u1(b);
    (sps->vui).colour_description_present_flag = uVar1;
    if (h264_dbgfile == (FILE *)0x0) {
      local_b8 = _stdout;
    }
    else {
      local_b8 = (FILE *)h264_dbgfile;
    }
    fprintf(local_b8,"sps->vui.colour_description_present_flag: %d \n",
            (ulong)(uint)(sps->vui).colour_description_present_flag);
    if ((sps->vui).colour_description_present_flag != 0) {
      if (h264_dbgfile == (FILE *)0x0) {
        local_c0 = _stdout;
      }
      else {
        local_c0 = (FILE *)h264_dbgfile;
      }
      fprintf(local_c0,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      uVar1 = bs_read_u8(b);
      (sps->vui).colour_primaries = uVar1;
      if (h264_dbgfile == (FILE *)0x0) {
        local_c8 = _stdout;
      }
      else {
        local_c8 = (FILE *)h264_dbgfile;
      }
      fprintf(local_c8,"sps->vui.colour_primaries: %d \n",(ulong)(uint)(sps->vui).colour_primaries);
      if (h264_dbgfile == (FILE *)0x0) {
        local_d0 = _stdout;
      }
      else {
        local_d0 = (FILE *)h264_dbgfile;
      }
      fprintf(local_d0,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      uVar1 = bs_read_u8(b);
      (sps->vui).transfer_characteristics = uVar1;
      if (h264_dbgfile == (FILE *)0x0) {
        local_d8 = _stdout;
      }
      else {
        local_d8 = (FILE *)h264_dbgfile;
      }
      fprintf(local_d8,"sps->vui.transfer_characteristics: %d \n",
              (ulong)(uint)(sps->vui).transfer_characteristics);
      if (h264_dbgfile == (FILE *)0x0) {
        local_e0 = _stdout;
      }
      else {
        local_e0 = (FILE *)h264_dbgfile;
      }
      fprintf(local_e0,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      uVar1 = bs_read_u8(b);
      (sps->vui).matrix_coefficients = uVar1;
      if (h264_dbgfile == (FILE *)0x0) {
        local_e8 = _stdout;
      }
      else {
        local_e8 = (FILE *)h264_dbgfile;
      }
      fprintf(local_e8,"sps->vui.matrix_coefficients: %d \n",
              (ulong)(uint)(sps->vui).matrix_coefficients);
    }
  }
  if (h264_dbgfile == (FILE *)0x0) {
    local_f0 = _stdout;
  }
  else {
    local_f0 = (FILE *)h264_dbgfile;
  }
  fprintf(local_f0,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar1 = bs_read_u1(b);
  (sps->vui).chroma_loc_info_present_flag = uVar1;
  if (h264_dbgfile == (FILE *)0x0) {
    local_f8 = _stdout;
  }
  else {
    local_f8 = (FILE *)h264_dbgfile;
  }
  fprintf(local_f8,"sps->vui.chroma_loc_info_present_flag: %d \n",
          (ulong)(uint)(sps->vui).chroma_loc_info_present_flag);
  if ((sps->vui).chroma_loc_info_present_flag != 0) {
    if (h264_dbgfile == (FILE *)0x0) {
      local_100 = _stdout;
    }
    else {
      local_100 = (FILE *)h264_dbgfile;
    }
    fprintf(local_100,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar1 = bs_read_ue(b);
    (sps->vui).chroma_sample_loc_type_top_field = uVar1;
    if (h264_dbgfile == (FILE *)0x0) {
      local_108 = _stdout;
    }
    else {
      local_108 = (FILE *)h264_dbgfile;
    }
    fprintf(local_108,"sps->vui.chroma_sample_loc_type_top_field: %d \n",
            (ulong)(uint)(sps->vui).chroma_sample_loc_type_top_field);
    if (h264_dbgfile == (FILE *)0x0) {
      local_110 = _stdout;
    }
    else {
      local_110 = (FILE *)h264_dbgfile;
    }
    fprintf(local_110,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar1 = bs_read_ue(b);
    (sps->vui).chroma_sample_loc_type_bottom_field = uVar1;
    if (h264_dbgfile == (FILE *)0x0) {
      local_118 = _stdout;
    }
    else {
      local_118 = (FILE *)h264_dbgfile;
    }
    fprintf(local_118,"sps->vui.chroma_sample_loc_type_bottom_field: %d \n",
            (ulong)(uint)(sps->vui).chroma_sample_loc_type_bottom_field);
  }
  if (h264_dbgfile == (FILE *)0x0) {
    local_120 = _stdout;
  }
  else {
    local_120 = (FILE *)h264_dbgfile;
  }
  fprintf(local_120,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar1 = bs_read_u1(b);
  (sps->vui).timing_info_present_flag = uVar1;
  if (h264_dbgfile == (FILE *)0x0) {
    local_128 = _stdout;
  }
  else {
    local_128 = (FILE *)h264_dbgfile;
  }
  fprintf(local_128,"sps->vui.timing_info_present_flag: %d \n",
          (ulong)(uint)(sps->vui).timing_info_present_flag);
  if ((sps->vui).timing_info_present_flag != 0) {
    if (h264_dbgfile == (FILE *)0x0) {
      local_130 = _stdout;
    }
    else {
      local_130 = (FILE *)h264_dbgfile;
    }
    fprintf(local_130,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar1 = bs_read_u(b,0x20);
    (sps->vui).num_units_in_tick = uVar1;
    if (h264_dbgfile == (FILE *)0x0) {
      local_138 = _stdout;
    }
    else {
      local_138 = (FILE *)h264_dbgfile;
    }
    fprintf(local_138,"sps->vui.num_units_in_tick: %d \n",(ulong)(uint)(sps->vui).num_units_in_tick)
    ;
    if (h264_dbgfile == (FILE *)0x0) {
      local_140 = _stdout;
    }
    else {
      local_140 = (FILE *)h264_dbgfile;
    }
    fprintf(local_140,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar1 = bs_read_u(b,0x20);
    (sps->vui).time_scale = uVar1;
    if (h264_dbgfile == (FILE *)0x0) {
      local_148 = _stdout;
    }
    else {
      local_148 = (FILE *)h264_dbgfile;
    }
    fprintf(local_148,"sps->vui.time_scale: %d \n",(ulong)(uint)(sps->vui).time_scale);
    if (h264_dbgfile == (FILE *)0x0) {
      local_150 = _stdout;
    }
    else {
      local_150 = (FILE *)h264_dbgfile;
    }
    fprintf(local_150,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar1 = bs_read_u1(b);
    (sps->vui).fixed_frame_rate_flag = uVar1;
    if (h264_dbgfile == (FILE *)0x0) {
      local_158 = _stdout;
    }
    else {
      local_158 = (FILE *)h264_dbgfile;
    }
    fprintf(local_158,"sps->vui.fixed_frame_rate_flag: %d \n",
            (ulong)(uint)(sps->vui).fixed_frame_rate_flag);
  }
  if (h264_dbgfile == (FILE *)0x0) {
    local_160 = _stdout;
  }
  else {
    local_160 = (FILE *)h264_dbgfile;
  }
  fprintf(local_160,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar1 = bs_read_u1(b);
  (sps->vui).nal_hrd_parameters_present_flag = uVar1;
  if (h264_dbgfile == (FILE *)0x0) {
    local_168 = _stdout;
  }
  else {
    local_168 = (FILE *)h264_dbgfile;
  }
  fprintf(local_168,"sps->vui.nal_hrd_parameters_present_flag: %d \n",
          (ulong)(uint)(sps->vui).nal_hrd_parameters_present_flag);
  if ((sps->vui).nal_hrd_parameters_present_flag != 0) {
    read_debug_hrd_parameters(&sps->hrd_nal,b);
  }
  if (h264_dbgfile == (FILE *)0x0) {
    local_170 = _stdout;
  }
  else {
    local_170 = (FILE *)h264_dbgfile;
  }
  fprintf(local_170,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar1 = bs_read_u1(b);
  (sps->vui).vcl_hrd_parameters_present_flag = uVar1;
  if (h264_dbgfile == (FILE *)0x0) {
    local_178 = _stdout;
  }
  else {
    local_178 = (FILE *)h264_dbgfile;
  }
  fprintf(local_178,"sps->vui.vcl_hrd_parameters_present_flag: %d \n",
          (ulong)(uint)(sps->vui).vcl_hrd_parameters_present_flag);
  if ((sps->vui).vcl_hrd_parameters_present_flag != 0) {
    read_debug_hrd_parameters(&sps->hrd_vcl,b);
  }
  if (((sps->vui).nal_hrd_parameters_present_flag != 0) ||
     ((sps->vui).vcl_hrd_parameters_present_flag != 0)) {
    if (h264_dbgfile == (FILE *)0x0) {
      local_180 = _stdout;
    }
    else {
      local_180 = (FILE *)h264_dbgfile;
    }
    fprintf(local_180,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar1 = bs_read_u1(b);
    (sps->vui).low_delay_hrd_flag = uVar1;
    if (h264_dbgfile == (FILE *)0x0) {
      local_188 = _stdout;
    }
    else {
      local_188 = (FILE *)h264_dbgfile;
    }
    fprintf(local_188,"sps->vui.low_delay_hrd_flag: %d \n",
            (ulong)(uint)(sps->vui).low_delay_hrd_flag);
  }
  if (h264_dbgfile == (FILE *)0x0) {
    local_190 = _stdout;
  }
  else {
    local_190 = (FILE *)h264_dbgfile;
  }
  fprintf(local_190,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar1 = bs_read_u1(b);
  (sps->vui).pic_struct_present_flag = uVar1;
  if (h264_dbgfile == (FILE *)0x0) {
    local_198 = _stdout;
  }
  else {
    local_198 = (FILE *)h264_dbgfile;
  }
  fprintf(local_198,"sps->vui.pic_struct_present_flag: %d \n",
          (ulong)(uint)(sps->vui).pic_struct_present_flag);
  if (h264_dbgfile == (FILE *)0x0) {
    local_1a0 = _stdout;
  }
  else {
    local_1a0 = (FILE *)h264_dbgfile;
  }
  fprintf(local_1a0,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar1 = bs_read_u1(b);
  (sps->vui).bitstream_restriction_flag = uVar1;
  if (h264_dbgfile == (FILE *)0x0) {
    local_1a8 = _stdout;
  }
  else {
    local_1a8 = (FILE *)h264_dbgfile;
  }
  fprintf(local_1a8,"sps->vui.bitstream_restriction_flag: %d \n",
          (ulong)(uint)(sps->vui).bitstream_restriction_flag);
  if ((sps->vui).bitstream_restriction_flag != 0) {
    if (h264_dbgfile == (FILE *)0x0) {
      local_1b0 = _stdout;
    }
    else {
      local_1b0 = (FILE *)h264_dbgfile;
    }
    fprintf(local_1b0,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar1 = bs_read_u1(b);
    (sps->vui).motion_vectors_over_pic_boundaries_flag = uVar1;
    if (h264_dbgfile == (FILE *)0x0) {
      local_1b8 = _stdout;
    }
    else {
      local_1b8 = (FILE *)h264_dbgfile;
    }
    fprintf(local_1b8,"sps->vui.motion_vectors_over_pic_boundaries_flag: %d \n",
            (ulong)(uint)(sps->vui).motion_vectors_over_pic_boundaries_flag);
    if (h264_dbgfile == (FILE *)0x0) {
      local_1c0 = _stdout;
    }
    else {
      local_1c0 = (FILE *)h264_dbgfile;
    }
    fprintf(local_1c0,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar1 = bs_read_ue(b);
    (sps->vui).max_bytes_per_pic_denom = uVar1;
    if (h264_dbgfile == (FILE *)0x0) {
      local_1c8 = _stdout;
    }
    else {
      local_1c8 = (FILE *)h264_dbgfile;
    }
    fprintf(local_1c8,"sps->vui.max_bytes_per_pic_denom: %d \n",
            (ulong)(uint)(sps->vui).max_bytes_per_pic_denom);
    if (h264_dbgfile == (FILE *)0x0) {
      local_1d0 = _stdout;
    }
    else {
      local_1d0 = (FILE *)h264_dbgfile;
    }
    fprintf(local_1d0,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar1 = bs_read_ue(b);
    (sps->vui).max_bits_per_mb_denom = uVar1;
    if (h264_dbgfile == (FILE *)0x0) {
      local_1d8 = _stdout;
    }
    else {
      local_1d8 = (FILE *)h264_dbgfile;
    }
    fprintf(local_1d8,"sps->vui.max_bits_per_mb_denom: %d \n",
            (ulong)(uint)(sps->vui).max_bits_per_mb_denom);
    if (h264_dbgfile == (FILE *)0x0) {
      local_1e0 = _stdout;
    }
    else {
      local_1e0 = (FILE *)h264_dbgfile;
    }
    fprintf(local_1e0,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar1 = bs_read_ue(b);
    (sps->vui).log2_max_mv_length_horizontal = uVar1;
    if (h264_dbgfile == (FILE *)0x0) {
      local_1e8 = _stdout;
    }
    else {
      local_1e8 = (FILE *)h264_dbgfile;
    }
    fprintf(local_1e8,"sps->vui.log2_max_mv_length_horizontal: %d \n",
            (ulong)(uint)(sps->vui).log2_max_mv_length_horizontal);
    if (h264_dbgfile == (FILE *)0x0) {
      local_1f0 = _stdout;
    }
    else {
      local_1f0 = (FILE *)h264_dbgfile;
    }
    fprintf(local_1f0,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar1 = bs_read_ue(b);
    (sps->vui).log2_max_mv_length_vertical = uVar1;
    if (h264_dbgfile == (FILE *)0x0) {
      local_1f8 = _stdout;
    }
    else {
      local_1f8 = (FILE *)h264_dbgfile;
    }
    fprintf(local_1f8,"sps->vui.log2_max_mv_length_vertical: %d \n",
            (ulong)(uint)(sps->vui).log2_max_mv_length_vertical);
    if (h264_dbgfile == (FILE *)0x0) {
      local_200 = _stdout;
    }
    else {
      local_200 = (FILE *)h264_dbgfile;
    }
    fprintf(local_200,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar1 = bs_read_ue(b);
    (sps->vui).num_reorder_frames = uVar1;
    if (h264_dbgfile == (FILE *)0x0) {
      local_208 = _stdout;
    }
    else {
      local_208 = (FILE *)h264_dbgfile;
    }
    fprintf(local_208,"sps->vui.num_reorder_frames: %d \n",
            (ulong)(uint)(sps->vui).num_reorder_frames);
    if (h264_dbgfile == (FILE *)0x0) {
      local_210 = _stdout;
    }
    else {
      local_210 = (FILE *)h264_dbgfile;
    }
    fprintf(local_210,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar1 = bs_read_ue(b);
    (sps->vui).max_dec_frame_buffering = uVar1;
    if (h264_dbgfile == (FILE *)0x0) {
      local_218 = _stdout;
    }
    else {
      local_218 = (FILE *)h264_dbgfile;
    }
    fprintf(local_218,"sps->vui.max_dec_frame_buffering: %d \n",
            (ulong)(uint)(sps->vui).max_dec_frame_buffering);
  }
  return;
}

Assistant:

void read_debug_vui_parameters(sps_t* sps, bs_t* b)
{
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.aspect_ratio_info_present_flag = bs_read_u1(b); printf("sps->vui.aspect_ratio_info_present_flag: %d \n", sps->vui.aspect_ratio_info_present_flag); 
    if( sps->vui.aspect_ratio_info_present_flag )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.aspect_ratio_idc = bs_read_u8(b); printf("sps->vui.aspect_ratio_idc: %d \n", sps->vui.aspect_ratio_idc); 
        if( sps->vui.aspect_ratio_idc == SAR_Extended )
        {
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.sar_width = bs_read_u(b, 16); printf("sps->vui.sar_width: %d \n", sps->vui.sar_width); 
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.sar_height = bs_read_u(b, 16); printf("sps->vui.sar_height: %d \n", sps->vui.sar_height); 
        }
    }
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.overscan_info_present_flag = bs_read_u1(b); printf("sps->vui.overscan_info_present_flag: %d \n", sps->vui.overscan_info_present_flag); 
    if( sps->vui.overscan_info_present_flag )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.overscan_appropriate_flag = bs_read_u1(b); printf("sps->vui.overscan_appropriate_flag: %d \n", sps->vui.overscan_appropriate_flag); 
    }
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.video_signal_type_present_flag = bs_read_u1(b); printf("sps->vui.video_signal_type_present_flag: %d \n", sps->vui.video_signal_type_present_flag); 
    if( sps->vui.video_signal_type_present_flag )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.video_format = bs_read_u(b, 3); printf("sps->vui.video_format: %d \n", sps->vui.video_format); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.video_full_range_flag = bs_read_u1(b); printf("sps->vui.video_full_range_flag: %d \n", sps->vui.video_full_range_flag); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.colour_description_present_flag = bs_read_u1(b); printf("sps->vui.colour_description_present_flag: %d \n", sps->vui.colour_description_present_flag); 
        if( sps->vui.colour_description_present_flag )
        {
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.colour_primaries = bs_read_u8(b); printf("sps->vui.colour_primaries: %d \n", sps->vui.colour_primaries); 
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.transfer_characteristics = bs_read_u8(b); printf("sps->vui.transfer_characteristics: %d \n", sps->vui.transfer_characteristics); 
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.matrix_coefficients = bs_read_u8(b); printf("sps->vui.matrix_coefficients: %d \n", sps->vui.matrix_coefficients); 
        }
    }
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.chroma_loc_info_present_flag = bs_read_u1(b); printf("sps->vui.chroma_loc_info_present_flag: %d \n", sps->vui.chroma_loc_info_present_flag); 
    if( sps->vui.chroma_loc_info_present_flag )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.chroma_sample_loc_type_top_field = bs_read_ue(b); printf("sps->vui.chroma_sample_loc_type_top_field: %d \n", sps->vui.chroma_sample_loc_type_top_field); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.chroma_sample_loc_type_bottom_field = bs_read_ue(b); printf("sps->vui.chroma_sample_loc_type_bottom_field: %d \n", sps->vui.chroma_sample_loc_type_bottom_field); 
    }
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.timing_info_present_flag = bs_read_u1(b); printf("sps->vui.timing_info_present_flag: %d \n", sps->vui.timing_info_present_flag); 
    if( sps->vui.timing_info_present_flag )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.num_units_in_tick = bs_read_u(b, 32); printf("sps->vui.num_units_in_tick: %d \n", sps->vui.num_units_in_tick); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.time_scale = bs_read_u(b, 32); printf("sps->vui.time_scale: %d \n", sps->vui.time_scale); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.fixed_frame_rate_flag = bs_read_u1(b); printf("sps->vui.fixed_frame_rate_flag: %d \n", sps->vui.fixed_frame_rate_flag); 
    }
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.nal_hrd_parameters_present_flag = bs_read_u1(b); printf("sps->vui.nal_hrd_parameters_present_flag: %d \n", sps->vui.nal_hrd_parameters_present_flag); 
    if( sps->vui.nal_hrd_parameters_present_flag )
    {
        read_debug_hrd_parameters(&sps->hrd_nal, b);
    }
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.vcl_hrd_parameters_present_flag = bs_read_u1(b); printf("sps->vui.vcl_hrd_parameters_present_flag: %d \n", sps->vui.vcl_hrd_parameters_present_flag); 
    if( sps->vui.vcl_hrd_parameters_present_flag )
    {
        read_debug_hrd_parameters(&sps->hrd_vcl, b);
    }
    if( sps->vui.nal_hrd_parameters_present_flag || sps->vui.vcl_hrd_parameters_present_flag )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.low_delay_hrd_flag = bs_read_u1(b); printf("sps->vui.low_delay_hrd_flag: %d \n", sps->vui.low_delay_hrd_flag); 
    }
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.pic_struct_present_flag = bs_read_u1(b); printf("sps->vui.pic_struct_present_flag: %d \n", sps->vui.pic_struct_present_flag); 
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.bitstream_restriction_flag = bs_read_u1(b); printf("sps->vui.bitstream_restriction_flag: %d \n", sps->vui.bitstream_restriction_flag); 
    if( sps->vui.bitstream_restriction_flag )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.motion_vectors_over_pic_boundaries_flag = bs_read_u1(b); printf("sps->vui.motion_vectors_over_pic_boundaries_flag: %d \n", sps->vui.motion_vectors_over_pic_boundaries_flag); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.max_bytes_per_pic_denom = bs_read_ue(b); printf("sps->vui.max_bytes_per_pic_denom: %d \n", sps->vui.max_bytes_per_pic_denom); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.max_bits_per_mb_denom = bs_read_ue(b); printf("sps->vui.max_bits_per_mb_denom: %d \n", sps->vui.max_bits_per_mb_denom); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.log2_max_mv_length_horizontal = bs_read_ue(b); printf("sps->vui.log2_max_mv_length_horizontal: %d \n", sps->vui.log2_max_mv_length_horizontal); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.log2_max_mv_length_vertical = bs_read_ue(b); printf("sps->vui.log2_max_mv_length_vertical: %d \n", sps->vui.log2_max_mv_length_vertical); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.num_reorder_frames = bs_read_ue(b); printf("sps->vui.num_reorder_frames: %d \n", sps->vui.num_reorder_frames); 
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sps->vui.max_dec_frame_buffering = bs_read_ue(b); printf("sps->vui.max_dec_frame_buffering: %d \n", sps->vui.max_dec_frame_buffering); 
    }
}